

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# controller.cpp
# Opt level: O2

void __thiscall
Controller::Controller
          (Controller *this,int width,int height,int mine_count,int seed,bool only_autodiscover)

{
  Minefield MStack_98;
  
  Minefield::Minefield(&this->mfield,8,8,10,0);
  this->x = 0;
  this->y = 0;
  Minefield::Minefield(&MStack_98,width,height,mine_count,seed);
  Minefield::operator=(&this->mfield,&MStack_98);
  Minefield::~Minefield(&MStack_98);
  this->autodiscover_only = only_autodiscover;
  return;
}

Assistant:

Controller::Controller(int width, int height, int mine_count, int seed, bool only_autodiscover) {
    x = 0;
    y = 0;

    mfield = Minefield(width, height, mine_count, seed);
    autodiscover_only = only_autodiscover;
}